

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O2

void __thiscall ExecutionEngine::i_lstore_0(ExecutionEngine *this)

{
  VMStack *this_00;
  Frame *this_01;
  Value VVar1;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  VVar1 = Frame::popTopOfOperandStack(this_01);
  if (VVar1.type != LONG) {
    __assert_fail("value.type == ValueType::LONG",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x536,"void ExecutionEngine::i_lstore_0()");
  }
  Frame::changeLocalVariable(this_01,VVar1,0);
  VVar1 = Frame::popTopOfOperandStack(this_01);
  if ((VVar1._0_8_ & 0xffffffff00000000) == 0xa00000000) {
    Frame::changeLocalVariable(this_01,VVar1,1);
    this_01->pc = this_01->pc + 1;
    return;
  }
  __assert_fail("value.type == ValueType::PADDING",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0x53a,"void ExecutionEngine::i_lstore_0()");
}

Assistant:

void ExecutionEngine::i_lstore_0() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();

    Value value = topFrame->popTopOfOperandStack();
    assert(value.type == ValueType::LONG);
    topFrame->changeLocalVariable(value, 0);

    value = topFrame->popTopOfOperandStack();
    assert(value.type == ValueType::PADDING);
    topFrame->changeLocalVariable(value, 1);

    topFrame->pc += 1;
}